

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

bool __thiscall GenericAssemblerFile::seekVirtual(GenericAssemblerFile *this,int64_t virtualAddress)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  
  lVar1 = this->headerSize;
  if (virtualAddress < lVar1) {
    Logger::queueError<>(Error,"Seeking to virtual address with negative physical address");
  }
  else {
    iVar3 = lVar1;
    if (virtualAddress < 0) {
      Logger::queueError<>(Warning,"Seeking to negative virtual address");
      iVar3 = this->headerSize;
    }
    this->virtualAddress = virtualAddress;
    iVar2 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[4])(this);
    if ((char)iVar2 != '\0') {
      std::ostream::seekp(&this->stream,virtualAddress - iVar3,0);
    }
  }
  return lVar1 <= virtualAddress;
}

Assistant:

bool GenericAssemblerFile::seekVirtual(int64_t virtualAddress)
{
	if (virtualAddress - headerSize < 0)
	{
		Logger::queueError(Logger::Error, "Seeking to virtual address with negative physical address");
		return false;
	}
	if (virtualAddress < 0)
		Logger::queueError(Logger::Warning, "Seeking to negative virtual address");

	this->virtualAddress = virtualAddress;
	int64_t physicalAddress = virtualAddress-headerSize;

	if (isOpen())
		stream.seekp(physicalAddress);

	return true;
}